

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring64_unit.cpp
# Opt level: O2

void anon_unknown.dwarf_3ee9::test_or_cardinality(void **param_1)

{
  roaring64_bitmap_t *r;
  roaring64_bitmap_t *r_00;
  uint64_t a;
  
  r = roaring64_bitmap_create();
  r_00 = roaring64_bitmap_create();
  roaring64_bitmap_add(r,100000);
  roaring64_bitmap_add(r,0x186a1);
  roaring64_bitmap_add(r,200000);
  roaring64_bitmap_add(r,300000);
  roaring64_bitmap_add(r_00,0x186a1);
  roaring64_bitmap_add(r_00,200000);
  roaring64_bitmap_add(r_00,400000);
  a = roaring64_bitmap_or_cardinality(r,r_00);
  _assert_int_equal(a,5,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/roaring64_unit.cpp"
                    ,0x4be);
  roaring64_bitmap_free(r);
  roaring64_bitmap_free(r_00);
  return;
}

Assistant:

DEFINE_TEST(test_or_cardinality) {
    roaring64_bitmap_t* r1 = roaring64_bitmap_create();
    roaring64_bitmap_t* r2 = roaring64_bitmap_create();

    roaring64_bitmap_add(r1, 100000);
    roaring64_bitmap_add(r1, 100001);
    roaring64_bitmap_add(r1, 200000);
    roaring64_bitmap_add(r1, 300000);

    roaring64_bitmap_add(r2, 100001);
    roaring64_bitmap_add(r2, 200000);
    roaring64_bitmap_add(r2, 400000);

    assert_int_equal(roaring64_bitmap_or_cardinality(r1, r2), 5);

    roaring64_bitmap_free(r1);
    roaring64_bitmap_free(r2);
}